

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

pthread_t * gpioStartThread(gpioThreadFunc_t *f,void *userdata)

{
  int iVar1;
  pthread_t *__newthread;
  char *__format;
  FILE *pFVar2;
  pthread_attr_t pthAttr;
  
  pFVar2 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar2,"%s %s: f=%08X, userdata=%08X\n",myTimeStamp::buf,"gpioStartThread",
            (ulong)f & 0xffffffff,(ulong)userdata & 0xffffffff);
  }
  pFVar2 = _stderr;
  if (libInitialised == '\0') {
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      __format = "%s %s: pigpio uninitialised, call gpioInitialise()\n";
      goto LAB_00119a07;
    }
  }
  else {
    __newthread = (pthread_t *)malloc(8);
    if (__newthread != (pthread_t *)0x0) {
      iVar1 = pthread_attr_init((pthread_attr_t *)&pthAttr);
      if (iVar1 == 0) {
        iVar1 = pthread_attr_setstacksize((pthread_attr_t *)&pthAttr,0x40000);
        if (iVar1 == 0) {
          iVar1 = pthread_create(__newthread,(pthread_attr_t *)&pthAttr,(__start_routine *)f,
                                 userdata);
          if (iVar1 == 0) {
            return __newthread;
          }
          free(__newthread);
          pFVar2 = _stderr;
          if ((gpioCfg.internals >> 10 & 1) == 0) {
            myTimeStamp();
            __format = "%s %s: pthread_create failed\n";
            goto LAB_00119a07;
          }
        }
        else {
          free(__newthread);
          pFVar2 = _stderr;
          if ((gpioCfg.internals >> 10 & 1) == 0) {
            myTimeStamp();
            __format = "%s %s: pthread_attr_setstacksize failed\n";
LAB_00119a07:
            fprintf(pFVar2,__format,myTimeStamp::buf,"gpioStartThread");
            return (pthread_t *)0x0;
          }
        }
      }
      else {
        free(__newthread);
        pFVar2 = _stderr;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          myTimeStamp();
          __format = "%s %s: pthread_attr_init failed\n";
          goto LAB_00119a07;
        }
      }
    }
  }
  return (pthread_t *)0x0;
}

Assistant:

pthread_t *gpioStartThread(gpioThreadFunc_t f, void *userdata)
{
   pthread_t *pth;
   pthread_attr_t pthAttr;

   DBG(DBG_USER, "f=%08X, userdata=%08X", (uint32_t)f, (uint32_t)userdata);

   CHECK_INITED_RET_NULL_PTR;

   pth = malloc(sizeof(pthread_t));

   if (pth)
   {
      if (pthread_attr_init(&pthAttr))
      {
         free(pth);
         SOFT_ERROR(NULL, "pthread_attr_init failed");
      }

      if (pthread_attr_setstacksize(&pthAttr, STACK_SIZE))
      {
         free(pth);
         SOFT_ERROR(NULL, "pthread_attr_setstacksize failed");
      }

      if (pthread_create(pth, &pthAttr, f, userdata))
      {
         free(pth);
         SOFT_ERROR(NULL, "pthread_create failed");
      }
   }
   return pth;
}